

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_tests.cpp
# Opt level: O0

void __thiscall allocator_tests::lockedpool_tests_live::test_method(lockedpool_tests_live *this)

{
  bool bVar1;
  LockedPool *pLVar2;
  long in_FS_OFFSET;
  runtime_error *anon_var_0;
  LockedPoolManager *pool;
  void *a0;
  Stats initial;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffc28;
  undefined7 in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc37;
  assertion_result *in_stack_fffffffffffffc38;
  LockedPool *in_stack_fffffffffffffc48;
  const_string *in_stack_fffffffffffffc50;
  const_string *msg;
  lazy_ostream *in_stack_fffffffffffffc58;
  const_string *in_stack_fffffffffffffc60;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffffc68;
  unit_test_log_t *this_00;
  undefined7 in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffc87;
  LockedPool *in_stack_fffffffffffffc88;
  const_string local_300 [2];
  lazy_ostream local_2e0;
  assertion_result local_290;
  const_string local_278 [2];
  const_string local_258;
  lazy_ostream local_238 [5];
  assertion_result local_1e8;
  unit_test_log_t local_1c0 [2];
  const_string local_1b0 [2];
  lazy_ostream local_190 [2];
  undefined4 local_16c;
  assertion_result local_168 [2];
  const_string local_130 [2];
  lazy_ostream local_110 [2];
  assertion_result local_f0 [2];
  const_string local_b8 [2];
  lazy_ostream local_98 [2];
  assertion_result local_78 [2];
  undefined4 *local_40;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pLVar2 = &LockedPoolManager::Instance()->super_LockedPool;
  LockedPool::stats(in_stack_fffffffffffffc48);
  local_40 = (undefined4 *)
             LockedPool::alloc(in_stack_fffffffffffffc88,
                               CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (unsigned_long)in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,(size_t)in_stack_fffffffffffffc58
               ,in_stack_fffffffffffffc50);
    boost::test_tools::assertion_result::assertion_result<void*>
              (in_stack_fffffffffffffc38,
               (void **)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (unsigned_long)in_stack_fffffffffffffc28);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (basic_cstring<const_char> *)in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (unsigned_long)in_stack_fffffffffffffc28);
    in_stack_fffffffffffffc28 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_78,local_98,local_b8,0xdd,CHECK,CHECK_PRED)
    ;
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffc28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  *local_40 = 0x1234;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (unsigned_long)in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,(size_t)in_stack_fffffffffffffc58
               ,in_stack_fffffffffffffc50);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffc38,(bool)in_stack_fffffffffffffc37);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (unsigned_long)in_stack_fffffffffffffc28);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (basic_cstring<const_char> *)in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (unsigned_long)in_stack_fffffffffffffc28);
    in_stack_fffffffffffffc28 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_f0,local_110,local_130,0xe0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffc28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  LockedPool::free(pLVar2,local_40);
  LockedPool::free(pLVar2,local_40);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (unsigned_long)in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,(size_t)in_stack_fffffffffffffc58
               ,in_stack_fffffffffffffc50);
    local_16c = 0;
    boost::test_tools::assertion_result::assertion_result<int>
              (in_stack_fffffffffffffc38,
               (int *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (unsigned_long)in_stack_fffffffffffffc28);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (basic_cstring<const_char> *)in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (unsigned_long)in_stack_fffffffffffffc28);
    in_stack_fffffffffffffc28 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_168,local_190,local_1b0,0xe5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffc28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    this_00 = local_1c0;
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (unsigned_long)in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,file,(size_t)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
    LockedPool::stats(in_stack_fffffffffffffc48);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffc38,(bool)in_stack_fffffffffffffc37);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (unsigned_long)in_stack_fffffffffffffc28);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (basic_cstring<const_char> *)in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (unsigned_long)in_stack_fffffffffffffc28);
    in_stack_fffffffffffffc28 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1e8,local_238,&local_258,0xea,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffc28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    pLVar2 = (LockedPool *)(local_278 + 1);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (unsigned_long)in_stack_fffffffffffffc28);
    msg = local_278;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,file,(size_t)in_stack_fffffffffffffc58,msg);
    LockedPool::stats(pLVar2);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffc38,(bool)in_stack_fffffffffffffc37);
    in_stack_fffffffffffffc58 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (unsigned_long)in_stack_fffffffffffffc28);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (basic_cstring<const_char> *)in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (unsigned_long)in_stack_fffffffffffffc28);
    in_stack_fffffffffffffc28 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_290,&local_2e0,local_300,0xec,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffc28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(lockedpool_tests_live)
{
    LockedPoolManager &pool = LockedPoolManager::Instance();
    LockedPool::Stats initial = pool.stats();

    void *a0 = pool.alloc(16);
    BOOST_CHECK(a0);
    // Test reading and writing the allocated memory
    *((uint32_t*)a0) = 0x1234;
    BOOST_CHECK(*((uint32_t*)a0) == 0x1234);

    pool.free(a0);
    try { // Test exception on double-free
        pool.free(a0);
        BOOST_CHECK(0);
    } catch(std::runtime_error &)
    {
    }
    // If more than one new arena was allocated for the above tests, something is wrong
    BOOST_CHECK(pool.stats().total <= (initial.total + LockedPool::ARENA_SIZE));
    // Usage must be back to where it started
    BOOST_CHECK(pool.stats().used == initial.used);
}